

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<std::_List_iterator<State>_>::relocate
          (QArrayDataPointer<std::_List_iterator<State>_> *this,qsizetype offset,
          _List_iterator<State> **data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<std::_List_iterator<State>_> *in_RDI;
  _List_iterator<State> **unaff_retaddr;
  _List_iterator<State> *res;
  _List_iterator<State> *first;
  QArrayDataPointer<std::_List_iterator<State>_> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<std::_List_iterator<State>,long_long>
            (first,(longlong)in_RDI,(_List_iterator<State> *)0x133f17);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<std::_List_iterator<State>>,std::_List_iterator<State>const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 8 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }